

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int vm_builtin_func_exists(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_vm *pjVar1;
  undefined8 in_RAX;
  char *pKey;
  SyHashEntry *pSVar2;
  int iBool;
  int nLen;
  
  nLen = (int)((ulong)in_RAX >> 0x20);
  if (nArg < 1) {
    iBool = 0;
  }
  else {
    pjVar1 = pCtx->pVm;
    pKey = jx9_value_to_string(*apArg,&nLen);
    pSVar2 = SyHashGet(&pjVar1->hFunction,pKey,nLen);
    if ((pSVar2 == (SyHashEntry *)0x0) &&
       (pSVar2 = SyHashGet(&pjVar1->hHostFunction,pKey,nLen), pSVar2 == (SyHashEntry *)0x0)) {
      iBool = 0;
    }
    else {
      iBool = 1;
    }
  }
  jx9_result_bool(pCtx,iBool);
  return 0;
}

Assistant:

static int vm_builtin_func_exists(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zName;
	jx9_vm *pVm;
	int nLen;
	int res;
	if( nArg < 1 ){
		/* Missing argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return SXRET_OK;
	}
	/* Point to the target VM */
	pVm = pCtx->pVm;
	/* Extract the function name */
	zName = jx9_value_to_string(apArg[0], &nLen);
	/* Assume the function is not defined */
	res = 0;
	/* Perform the lookup */
	if( SyHashGet(&pVm->hFunction, (const void *)zName, (sxu32)nLen) != 0 ||
		SyHashGet(&pVm->hHostFunction, (const void *)zName, (sxu32)nLen) != 0 ){
			/* Function is defined */
			res = 1;
	}
	jx9_result_bool(pCtx, res);
	return SXRET_OK;
}